

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_energy_matrix.cpp
# Opt level: O3

void __thiscall
s_energy_matrix::compute_energy_restricted
          (s_energy_matrix *this,cand_pos_t i,cand_pos_t j,sparse_tree *tree)

{
  pointer pNVar1;
  pointer pfVar2;
  energy_t eVar3;
  int iVar4;
  char cVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  int iVar9;
  energy_t min_en [3];
  energy_t local_3c [3];
  
  local_3c[0] = 10000000;
  local_3c[1] = 10000000;
  local_3c[2] = 10000000;
  pNVar1 = (tree->tree).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = pNVar1[i].pair;
  if (iVar4 < -1) {
    iVar9 = pNVar1[j].pair;
    bVar7 = iVar9 < -1;
    if (iVar4 == j) goto LAB_00112ba3;
    if (-2 < iVar9) goto LAB_00112c10;
  }
  else {
    if (iVar4 != j) goto LAB_00112c10;
    iVar9 = pNVar1[j].pair;
    bVar7 = false;
LAB_00112ba3:
    if (iVar9 != i && !bVar7) goto LAB_00112c10;
  }
  if (~i + j <= (tree->up).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[(long)j + -1]) {
    eVar3 = HairpinE(this,&this->seq_,this->S_,this->S1_,this->params_,i,j);
    local_3c[0] = eVar3;
  }
  eVar3 = compute_internal_restricted(this,i,j,this->params_,&tree->up);
  local_3c[1] = eVar3;
  local_3c[2] = compute_energy_VM_restricted(this,i,j,tree);
LAB_00112c10:
  uVar8 = 0xffffffff;
  iVar4 = 5000000;
  uVar6 = 0;
  do {
    if (local_3c[uVar6] < iVar4) {
      uVar8 = uVar6 & 0xffffffff;
      iVar4 = local_3c[uVar6];
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 != 3);
  if (iVar4 < 5000000) {
    cVar5 = 'N';
    if ((uint)uVar8 < 3) {
      cVar5 = (char)(0x4d4948 >> ((char)uVar8 * '\b' & 0x1fU));
    }
    iVar9 = (j - i) + (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[i];
    pfVar2 = (this->nodes).super__Vector_base<free_energy_node,_std::allocator<free_energy_node>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pfVar2[iVar9].energy = iVar4;
    pfVar2[iVar9].type = cVar5;
  }
  return;
}

Assistant:

void s_energy_matrix::compute_energy_restricted (cand_pos_t i, cand_pos_t j, sparse_tree &tree)
// compute the V(i,j) value, if the structure must be restricted
{
    energy_t min, min_en[3];
    cand_pos_t k, min_rank;
    char type;

    min_rank = -1;
    min = INF/2;
    min_en[0] = INF;
    min_en[1] = INF;
    min_en[2] = INF;


	const pair_type ptype_closing = pair[S_[i]][S_[j]];
    const bool unpaired = (tree.tree[i].pair<-1 && tree.tree[j].pair<-1);
	const bool paired = (tree.tree[i].pair == j && tree.tree[j].pair == i);
    if (paired || unpaired)    // if i and j can pair
    {
        bool canH = !(tree.up[j-1]<(j-i-1));
        if(canH) min_en[0] = HairpinE(seq_,S_,S1_,params_,i,j);

        min_en[1] = compute_internal_restricted(i,j,params_,tree.up);
        min_en[2] = compute_energy_VM_restricted(i,j,tree);
    }

    for (k=0; k<3; k++)
    {
        if (min_en[k] < min)
        {
            min = min_en[k];
            min_rank = k;
        }
    }

    switch (min_rank)
    {
        case  0: type = HAIRP; break;
        case  1: type = INTER; break;
        case  2: type = MULTI; break;
        default: type = NONE;
    }

    if (min < INF/2) {
        int ij = index[i]+j-i;
        nodes[ij].energy = min;
        nodes[ij].type = type;
    }
}